

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::Delay3Syntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,Delay3Syntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  SyntaxNode *node;
  size_t index_local;
  Delay3Syntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->hash).kind;
    token._2_1_ = (this->hash).field_0x2;
    token.numFlags.raw = (this->hash).numFlags.raw;
    token.rawLen = (this->hash).rawLen;
    token.info = (this->hash).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->openParen).kind;
    token_00._2_1_ = (this->openParen).field_0x2;
    token_00.numFlags.raw = (this->openParen).numFlags.raw;
    token_00.rawLen = (this->openParen).rawLen;
    token_00.info = (this->openParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->delay1)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 3:
    token_01.kind = (this->comma1).kind;
    token_01._2_1_ = (this->comma1).field_0x2;
    token_01.numFlags.raw = (this->comma1).numFlags.raw;
    token_01.rawLen = (this->comma1).rawLen;
    token_01.info = (this->comma1).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 4:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->delay2->super_SyntaxNode);
    break;
  case 5:
    token_02.kind = (this->comma2).kind;
    token_02._2_1_ = (this->comma2).field_0x2;
    token_02.numFlags.raw = (this->comma2).numFlags.raw;
    token_02.rawLen = (this->comma2).rawLen;
    token_02.info = (this->comma2).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 6:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->delay3->super_SyntaxNode);
    break;
  case 7:
    token_03.kind = (this->closeParen).kind;
    token_03._2_1_ = (this->closeParen).field_0x2;
    token_03.numFlags.raw = (this->closeParen).numFlags.raw;
    token_03.rawLen = (this->closeParen).rawLen;
    token_03.info = (this->closeParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_03);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax Delay3Syntax::getChild(size_t index) const {
    switch (index) {
        case 0: return hash;
        case 1: return openParen;
        case 2: return delay1.get();
        case 3: return comma1;
        case 4: return delay2;
        case 5: return comma2;
        case 6: return delay3;
        case 7: return closeParen;
        default: return nullptr;
    }
}